

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::ChangeType
          (LocalStorage *this,DataTable *old_dt,DataTable *new_dt,idx_t changed_idx,
          LogicalType *target_type,vector<duckdb::StorageIndex,_true> *bound_columns,
          Expression *cast_expr)

{
  ClientContext *__args;
  type __args_2;
  undefined1 local_89;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  shared_ptr<duckdb::LocalTableStorage,_true> storage;
  idx_t changed_idx_local;
  shared_ptr<duckdb::LocalTableStorage,_true> local_58;
  shared_ptr<duckdb::LocalTableStorage> local_40;
  
  changed_idx_local = changed_idx;
  LocalTableManager::MoveEntry((LocalTableManager *)&storage,(DataTable *)&this->table_manager);
  if (storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    __args = this->context;
    __args_2 = shared_ptr<duckdb::LocalTableStorage,_true>::operator*(&storage);
    local_40.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::LocalTableStorage,std::allocator<duckdb::LocalTableStorage>,duckdb::ClientContext&,duckdb::DataTable&,duckdb::LocalTableStorage&,unsigned_long&,duckdb::LogicalType_const&,duckdb::vector<duckdb::StorageIndex,true>const&,duckdb::Expression&>
              (&local_40.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(LocalTableStorage **)&local_40,
               (allocator<duckdb::LocalTableStorage> *)&local_89,__args,new_dt,__args_2,
               &changed_idx_local,target_type,bound_columns,cast_expr);
    shared_ptr<duckdb::LocalTableStorage,_true>::shared_ptr(&new_storage,&local_40);
    if (local_40.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_58.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = new_storage.internal.
             super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         new_storage.internal.
         super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    new_storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    new_storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LocalTableManager::InsertEntry(&this->table_manager,new_dt,&local_58);
    if (local_58.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.
                 super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (new_storage.internal.
        super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (new_storage.internal.
                 super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (storage.internal.
               super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void LocalStorage::ChangeType(DataTable &old_dt, DataTable &new_dt, idx_t changed_idx, const LogicalType &target_type,
                              const vector<StorageIndex> &bound_columns, Expression &cast_expr) {
	// check if there are any pending appends for the old version of the table
	auto storage = table_manager.MoveEntry(old_dt);
	if (!storage) {
		return;
	}
	auto new_storage = make_shared_ptr<LocalTableStorage>(context, new_dt, *storage, changed_idx, target_type,
	                                                      bound_columns, cast_expr);
	table_manager.InsertEntry(new_dt, std::move(new_storage));
}